

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QList<QLocale> * QLocale::matchingLocales(Language language,Script script,Territory territory)

{
  initializer_list<QLocale> args;
  bool bVar1;
  QLocaleId QVar2;
  ulong uVar3;
  QLocaleData *pQVar4;
  undefined2 extraout_var;
  ushort in_SI;
  QList<QLocale> *in_RDI;
  long in_FS_OFFSET;
  QLocaleData *syslocaledata;
  quint16 index;
  QList<QLocale> *result;
  QLocaleId id_1;
  QLocaleId id;
  QLocaleId filter;
  undefined2 in_stack_fffffffffffffeb8;
  Territory in_stack_fffffffffffffeba;
  Script in_stack_fffffffffffffebc;
  Language in_stack_fffffffffffffebe;
  QList<QLocale> *in_stack_fffffffffffffec0;
  QLocaleData *in_stack_fffffffffffffec8;
  QList<QLocale> *in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  qsizetype in_stack_ffffffffffffff28;
  long *local_c8;
  ushort local_98;
  char local_60 [8];
  undefined4 local_58;
  uint local_54;
  undefined4 local_4c;
  ushort local_48;
  undefined4 local_44;
  ushort local_40;
  undefined4 local_30;
  ushort local_2c;
  undefined4 local_24;
  ushort local_20;
  undefined4 local_1c;
  ushort local_18;
  QLocaleId local_16;
  long local_10;
  long local_8;
  QList<QLocale> *this;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLocaleId::isValid(&local_16);
  if (bVar1) {
    if (in_SI == 1) {
      QLocale((QLocale *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebe,
              in_stack_fffffffffffffebc,in_stack_fffffffffffffeba);
      args._M_len = in_stack_fffffffffffffef8;
      args._M_array = in_stack_fffffffffffffef0;
      QList<QLocale>::QList(in_stack_fffffffffffffee8,args);
      local_c8 = &local_8;
      do {
        local_c8 = local_c8 + -1;
        ~QLocale((QLocale *)0x4d1526);
      } while (local_c8 != &local_10);
    }
    else {
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QLocale>::QList((QList<QLocale> *)0x4d1632);
      bVar1 = QLocaleId::matchesAll(&local_16);
      if (bVar1) {
        QList<QLocale>::reserve(in_stack_fffffffffffffee8,in_stack_ffffffffffffff28);
      }
      local_98 = locale_index[in_SI];
      while (bVar1 = QLocaleId::acceptLanguage(&local_16,locale_data[local_98].m_language_id), bVar1
            ) {
        local_18 = 0xaaaa;
        local_1c = 0xaaaaaaaa;
        QVar2 = QLocaleData::id((QLocaleData *)
                                CONCAT26(in_stack_fffffffffffffebe,
                                         CONCAT24(in_stack_fffffffffffffebc,
                                                  CONCAT22(in_stack_fffffffffffffeba,
                                                           in_stack_fffffffffffffeb8))));
        local_30 = QVar2._0_4_;
        local_2c = QVar2.territory_id;
        local_24 = local_30;
        local_20 = local_2c;
        local_1c = local_30;
        local_18 = local_2c;
        bVar1 = QLocaleId::acceptScriptTerritory(&local_16,QVar2);
        if (bVar1) {
          if ((short)local_1c == 1) {
            c_private();
          }
          else {
            operator_new(0x20);
            uVar3 = (ulong)local_98;
            pQVar4 = locale_data + uVar3;
            QFlags<QLocale::NumberOption>::QFlags
                      ((QFlags<QLocale::NumberOption> *)in_stack_fffffffffffffec0,
                       CONCAT22(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc));
            QLocalePrivate::QLocalePrivate
                      ((QLocalePrivate *)pQVar4,in_stack_fffffffffffffec8,
                       (qsizetype)in_stack_fffffffffffffec0,
                       (QFlagsStorageHelper<QLocale::NumberOption,_4>)SUB84(uVar3 >> 0x20,0),
                       CONCAT22(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc));
          }
          QLocale((QLocale *)in_stack_fffffffffffffec0,
                  (QLocalePrivate *)
                  CONCAT26(in_stack_fffffffffffffebe,
                           CONCAT24(in_stack_fffffffffffffebc,
                                    CONCAT22(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8))))
          ;
          QList<QLocale>::append
                    (in_stack_fffffffffffffec0,
                     (rvalue_ref)
                     CONCAT26(in_stack_fffffffffffffebe,
                              CONCAT24(in_stack_fffffffffffffebc,
                                       CONCAT22(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8)
                                      )));
          ~QLocale((QLocale *)0x4d1863);
        }
        local_98 = local_98 + 1;
      }
      pQVar4 = systemData((qsizetype *)in_stack_fffffffffffffec0);
      bVar1 = QLocaleId::acceptLanguage(&local_16,pQVar4->m_language_id);
      if (bVar1) {
        local_40 = 0xaaaa;
        local_44 = 0xaaaaaaaa;
        QVar2 = QLocaleData::id((QLocaleData *)
                                CONCAT26(in_stack_fffffffffffffebe,
                                         CONCAT24(in_stack_fffffffffffffebc,
                                                  CONCAT22(in_stack_fffffffffffffeba,
                                                           in_stack_fffffffffffffeb8))));
        this = (QList<QLocale> *)CONCAT26(extraout_var,QVar2);
        local_58 = QVar2._0_4_;
        local_48 = QVar2.territory_id;
        local_54 = CONCAT22(local_54._2_2_,local_48);
        local_4c = local_58;
        local_44 = local_58;
        local_40 = local_48;
        bVar1 = QLocaleId::acceptScriptTerritory
                          (&local_16,
                           (QLocaleId)((uint6)QVar2 & 0xffffffff | (uint6)local_54 << 0x20));
        if (bVar1) {
          system(local_60);
          QList<QLocale>::append
                    (this,(rvalue_ref)
                          CONCAT26(in_stack_fffffffffffffebe,
                                   CONCAT24(in_stack_fffffffffffffebc,
                                            CONCAT22(in_stack_fffffffffffffeba,
                                                     in_stack_fffffffffffffeb8))));
          ~QLocale((QLocale *)0x4d19fd);
        }
      }
    }
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QLocale>::QList((QList<QLocale> *)0x4d1486);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QLocale> QLocale::matchingLocales(Language language, Script script, Territory territory)
{
    const QLocaleId filter { language, script, territory };
    if (!filter.isValid())
        return QList<QLocale>();

    if (language == C)
        return QList<QLocale>{QLocale(C)};

    QList<QLocale> result;
    if (filter.matchesAll())
        result.reserve(locale_data_size);

    quint16 index = locale_index[language];
    // There may be no matches, for some languages (e.g. Abkhazian at CLDR v39).
    while (filter.acceptLanguage(locale_data[index].m_language_id)) {
        const QLocaleId id = locale_data[index].id();
        if (filter.acceptScriptTerritory(id)) {
            result.append(QLocale(*(id.language_id == C ? c_private()
                                    : new QLocalePrivate(locale_data + index, index))));
        }
        ++index;
    }

    // Add current system locale, if it matches
    const auto syslocaledata = systemData();

    if (filter.acceptLanguage(syslocaledata->m_language_id)) {
        const QLocaleId id = syslocaledata->id();
        if (filter.acceptScriptTerritory(id))
            result.append(system());
    }

    return result;
}